

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::
unordered_flat_map<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
::~unordered_flat_map
          (unordered_flat_map<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
           *this)

{
  value_type_pointer p;
  
  p = (this->table_).
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
      .arrays.elements_;
  if (p != (value_type_pointer)0x0) {
    operator_delete(p,(((this->table_).
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
                        .arrays.groups_size_mask * 0x178 + 0x186) / 3 & 0xfffffffffffffff8) * 3);
    return;
  }
  return;
}

Assistant:

~unordered_flat_map() = default;